

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_lanscapes_on_grid_test.cpp
# Opt level: O1

void __thiscall
check_construction_of_landscape_using_only_ten_levels::test_method
          (check_construction_of_landscape_using_only_ten_levels *this)

{
  long lVar1;
  long lVar2;
  vector<double,_std::allocator<double>_> v1;
  vector<double,_std::allocator<double>_> v2;
  Persistence_landscape_on_grid g;
  Persistence_landscape_on_grid l;
  vector<double,_std::allocator<double>_> local_148;
  vector<double,_std::allocator<double>_> local_130;
  undefined1 local_118 [8];
  undefined8 local_110;
  shared_count sStack_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined **local_c0;
  undefined1 local_b8;
  undefined8 *local_b0;
  char **local_a8;
  Persistence_landscape_on_grid local_a0;
  Persistence_landscape_on_grid local_68;
  
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
            (&local_68,"data/file_with_diagram_1",100,10,0xffff);
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
            (&local_a0,"data/file_with_diagram_1",100,0xffff);
  lVar1 = 0;
  do {
    Gudhi::Persistence_representations::Persistence_landscape_on_grid::vectorize
              (&local_148,&local_68,(int)lVar1);
    Gudhi::Persistence_representations::Persistence_landscape_on_grid::vectorize
              (&local_130,&local_a0,(int)lVar1);
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_on_grid_test.cpp"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x2d,&local_e0);
    local_118[0] = (long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start ==
                   (long)local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
    local_110 = 0;
    sStack_108.pi_ = (sp_counted_base *)0x0;
    local_f0 = "v1.size() == v2.size()";
    local_e8 = "";
    local_b8 = 0;
    local_c0 = &PTR__lazy_ostream_00114d00;
    local_b0 = &boost::unit_test::lazy_ostream::inst;
    local_a8 = &local_f0;
    local_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_on_grid_test.cpp"
    ;
    local_f8 = "";
    boost::test_tools::tt_detail::report_assertion(local_118,&local_c0,&local_100,0x2d,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_108);
    if (local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar2 = 0;
      do {
        GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>
                  (local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar2],
                   local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar2],2.220446049250313e-16);
        lVar2 = lVar2 + 1;
      } while (lVar2 != (long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3);
    }
    if (local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_a0.values_of_landscapes);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_68.values_of_landscapes);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_construction_of_landscape_using_only_ten_levels) {
  // TODO
  unsigned number = 10;
  Persistence_landscape_on_grid l("data/file_with_diagram_1", 100, number);
  Persistence_landscape_on_grid g("data/file_with_diagram_1", 100, std::numeric_limits<unsigned short>::max());
  // cut all the elements of order > 10 in g.

  for (size_t level = 0; level != number; ++level) {
    std::vector<double> v1 = l.vectorize(level);
    std::vector<double> v2 = g.vectorize(level);
    BOOST_CHECK(v1.size() == v2.size());
    for (size_t i = 0; i != v1.size(); ++i) {
      GUDHI_TEST_FLOAT_EQUALITY_CHECK(v1[i], v2[i]);
    }
  }
}